

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall
sentencepiece::SelfTestData_Sample::MergeFrom(SelfTestData_Sample *this,SelfTestData_Sample *from)

{
  InternalMetadata *this_00;
  uint uVar1;
  void *pvVar2;
  LogMessage *other;
  void *pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.cc",0x9dc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    pvVar3 = this_00->ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pbVar4 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar4,*(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->input_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar3 & 1) != 0) {
        pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->input_,(ulong)pvVar2 & 0xfffffffffffffffe,pvVar3);
    }
    if ((uVar1 & 2) != 0) {
      pvVar2 = (from->expected_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar3 & 1) != 0) {
        pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->expected_,(ulong)pvVar2 & 0xfffffffffffffffe,pvVar3);
    }
  }
  return;
}

Assistant:

void SelfTestData_Sample::MergeFrom(const SelfTestData_Sample& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.SelfTestData.Sample)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_input(from._internal_input());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_expected(from._internal_expected());
    }
  }
}